

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_variance_intrin_ssse3.c
# Opt level: O3

void masked_variance8xh(uint8_t *src_ptr,int src_stride,uint8_t *a_ptr,uint8_t *b_ptr,uint8_t *m_ptr
                       ,int m_stride,int height,uint *sse,int *sum_)

{
  uint8_t *puVar1;
  ulong uVar2;
  ulong uVar3;
  undefined8 uVar4;
  ulong uVar5;
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  unkuint9 Var21;
  undefined1 auVar22 [11];
  undefined1 auVar23 [15];
  undefined1 auVar24 [11];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  long lVar29;
  short sVar30;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  undefined1 auVar31 [16];
  short sVar40;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  int iVar42;
  int iVar43;
  undefined1 auVar41 [16];
  int iVar44;
  short sVar45;
  short sVar56;
  short sVar57;
  short sVar58;
  short sVar59;
  short sVar60;
  short sVar61;
  undefined1 auVar46 [16];
  undefined1 auVar54 [16];
  short sVar62;
  undefined1 auVar55 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  char cVar73;
  char cVar74;
  char cVar75;
  char cVar76;
  char cVar77;
  char cVar78;
  char cVar79;
  char cVar80;
  char cVar81;
  char cVar82;
  char cVar83;
  char cVar84;
  char cVar85;
  char cVar86;
  undefined1 auVar72 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  
  if (height < 1) {
    auVar41 = (undefined1  [16])0x0;
    auVar31 = (undefined1  [16])0x0;
  }
  else {
    lVar29 = 0;
    auVar41 = (undefined1  [16])0x0;
    auVar33 = (undefined1  [16])0x0;
    do {
      uVar2 = *(ulong *)src_ptr;
      uVar3 = *(ulong *)((long)src_ptr + (long)src_stride);
      auVar31 = *(undefined1 (*) [16])(a_ptr + lVar29 * 8);
      puVar1 = b_ptr + lVar29 * 8;
      uVar4 = *(undefined8 *)((long)m_ptr + (long)m_stride);
      uVar5 = *(ulong *)m_ptr;
      cVar73 = (char)(uVar5 >> 8);
      cVar74 = (char)(uVar5 >> 0x10);
      cVar75 = (char)(uVar5 >> 0x18);
      cVar76 = (char)(uVar5 >> 0x20);
      cVar77 = (char)(uVar5 >> 0x28);
      cVar78 = (char)(uVar5 >> 0x30);
      cVar79 = (char)(uVar5 >> 0x38);
      cVar80 = (char)((ulong)uVar4 >> 8);
      cVar81 = (char)((ulong)uVar4 >> 0x10);
      cVar82 = (char)((ulong)uVar4 >> 0x18);
      cVar83 = (char)((ulong)uVar4 >> 0x20);
      cVar84 = (char)((ulong)uVar4 >> 0x28);
      cVar85 = (char)((ulong)uVar4 >> 0x30);
      cVar86 = (char)((ulong)uVar4 >> 0x38);
      auVar53._0_14_ = auVar31._0_14_;
      auVar53[0xe] = auVar31[7];
      auVar53[0xf] = puVar1[7];
      auVar52._14_2_ = auVar53._14_2_;
      auVar52._0_13_ = auVar31._0_13_;
      auVar52[0xd] = puVar1[6];
      auVar51._13_3_ = auVar52._13_3_;
      auVar51._0_12_ = auVar31._0_12_;
      auVar51[0xc] = auVar31[6];
      auVar50._12_4_ = auVar51._12_4_;
      auVar50._0_11_ = auVar31._0_11_;
      auVar50[0xb] = puVar1[5];
      auVar49._11_5_ = auVar50._11_5_;
      auVar49._0_10_ = auVar31._0_10_;
      auVar49[10] = auVar31[5];
      auVar48._10_6_ = auVar49._10_6_;
      auVar48._0_9_ = auVar31._0_9_;
      auVar48[9] = puVar1[4];
      auVar47._9_7_ = auVar48._9_7_;
      auVar47._0_8_ = auVar31._0_8_;
      auVar47[8] = auVar31[4];
      auVar46._8_8_ = auVar47._8_8_;
      auVar46[7] = puVar1[3];
      auVar46[6] = auVar31[3];
      auVar46[5] = puVar1[2];
      auVar46[4] = auVar31[2];
      auVar46[3] = puVar1[1];
      auVar46[2] = auVar31[1];
      auVar46[0] = auVar31[0];
      auVar46[1] = *puVar1;
      auVar71._8_6_ = 0;
      auVar71._0_8_ = uVar5;
      auVar71[0xe] = cVar79;
      auVar71[0xf] = '@' - cVar79;
      auVar70._14_2_ = auVar71._14_2_;
      auVar70._8_5_ = 0;
      auVar70._0_8_ = uVar5;
      auVar70[0xd] = '@' - cVar78;
      auVar69._13_3_ = auVar70._13_3_;
      auVar69._8_4_ = 0;
      auVar69._0_8_ = uVar5;
      auVar69[0xc] = cVar78;
      auVar68._12_4_ = auVar69._12_4_;
      auVar68._8_3_ = 0;
      auVar68._0_8_ = uVar5;
      auVar68[0xb] = '@' - cVar77;
      auVar67._11_5_ = auVar68._11_5_;
      auVar67._8_2_ = 0;
      auVar67._0_8_ = uVar5;
      auVar67[10] = cVar77;
      auVar66._10_6_ = auVar67._10_6_;
      auVar66[8] = 0;
      auVar66._0_8_ = uVar5;
      auVar66[9] = '@' - cVar76;
      auVar65._9_7_ = auVar66._9_7_;
      auVar65[8] = cVar76;
      auVar65._0_8_ = uVar5;
      auVar64._8_8_ = auVar65._8_8_;
      auVar64[7] = '@' - cVar75;
      auVar64[6] = cVar75;
      auVar64[5] = '@' - cVar74;
      auVar64[4] = cVar74;
      auVar64[3] = '@' - cVar73;
      auVar64[2] = cVar73;
      auVar64[1] = '@' - (char)uVar5;
      auVar64[0] = (char)uVar5;
      auVar54 = pmaddubsw(auVar46,auVar64);
      sVar45 = pavgw(auVar54._0_2_ >> 5,0);
      sVar56 = pavgw(auVar54._2_2_ >> 5,0);
      sVar57 = pavgw(auVar54._4_2_ >> 5,0);
      sVar58 = pavgw(auVar54._6_2_ >> 5,0);
      sVar59 = pavgw(auVar54._8_2_ >> 5,0);
      sVar60 = pavgw(auVar54._10_2_ >> 5,0);
      sVar61 = pavgw(auVar54._12_2_ >> 5,0);
      sVar62 = pavgw(auVar54._14_2_ >> 5,0);
      auVar54[1] = puVar1[8];
      auVar54[0] = auVar31[8];
      auVar54[2] = auVar31[9];
      auVar54[3] = puVar1[9];
      auVar54[4] = auVar31[10];
      auVar54[5] = puVar1[10];
      auVar54[6] = auVar31[0xb];
      auVar54[7] = puVar1[0xb];
      auVar54[8] = auVar31[0xc];
      auVar54[9] = puVar1[0xc];
      auVar54[10] = auVar31[0xd];
      auVar54[0xb] = puVar1[0xd];
      auVar54[0xc] = auVar31[0xe];
      auVar54[0xd] = puVar1[0xe];
      auVar54[0xe] = auVar31[0xf];
      auVar54[0xf] = puVar1[0xf];
      auVar72[1] = '@' - (char)uVar4;
      auVar72[0] = (char)uVar4;
      auVar72[2] = cVar80;
      auVar72[3] = '@' - cVar80;
      auVar72[4] = cVar81;
      auVar72[5] = '@' - cVar81;
      auVar72[6] = cVar82;
      auVar72[7] = '@' - cVar82;
      auVar72[8] = cVar83;
      auVar72[9] = '@' - cVar83;
      auVar72[10] = cVar84;
      auVar72[0xb] = '@' - cVar84;
      auVar72[0xc] = cVar85;
      auVar72[0xd] = '@' - cVar85;
      auVar72[0xe] = cVar86;
      auVar72[0xf] = '@' - cVar86;
      auVar31 = pmaddubsw(auVar54,auVar72);
      sVar30 = pavgw(auVar31._0_2_ >> 5,0);
      sVar34 = pavgw(auVar31._2_2_ >> 5,0);
      sVar35 = pavgw(auVar31._4_2_ >> 5,0);
      sVar36 = pavgw(auVar31._6_2_ >> 5,0);
      sVar37 = pavgw(auVar31._8_2_ >> 5,0);
      sVar38 = pavgw(auVar31._10_2_ >> 5,0);
      sVar39 = pavgw(auVar31._12_2_ >> 5,0);
      sVar40 = pavgw(auVar31._14_2_ >> 5,0);
      auVar6._8_6_ = 0;
      auVar6._0_8_ = uVar2;
      auVar6[0xe] = (char)(uVar2 >> 0x38);
      auVar8._8_4_ = 0;
      auVar8._0_8_ = uVar2;
      auVar8[0xc] = (char)(uVar2 >> 0x30);
      auVar8._13_2_ = auVar6._13_2_;
      auVar10._8_4_ = 0;
      auVar10._0_8_ = uVar2;
      auVar10._12_3_ = auVar8._12_3_;
      auVar12._8_2_ = 0;
      auVar12._0_8_ = uVar2;
      auVar12[10] = (char)(uVar2 >> 0x28);
      auVar12._11_4_ = auVar10._11_4_;
      auVar14._8_2_ = 0;
      auVar14._0_8_ = uVar2;
      auVar14._10_5_ = auVar12._10_5_;
      auVar16[8] = (char)(uVar2 >> 0x20);
      auVar16._0_8_ = uVar2;
      auVar16._9_6_ = auVar14._9_6_;
      auVar20._7_8_ = 0;
      auVar20._0_7_ = auVar16._8_7_;
      Var21 = CONCAT81(SUB158(auVar20 << 0x40,7),(char)(uVar2 >> 0x18));
      auVar25._9_6_ = 0;
      auVar25._0_9_ = Var21;
      auVar22._1_10_ = SUB1510(auVar25 << 0x30,5);
      auVar22[0] = (char)(uVar2 >> 0x10);
      auVar26._11_4_ = 0;
      auVar26._0_11_ = auVar22;
      auVar18[2] = (char)(uVar2 >> 8);
      auVar18._0_2_ = (ushort)uVar2;
      auVar18._3_12_ = SUB1512(auVar26 << 0x20,3);
      auVar55._0_2_ = sVar45 - ((ushort)uVar2 & 0xff);
      auVar55._2_2_ = sVar56 - auVar18._2_2_;
      auVar55._4_2_ = sVar57 - auVar22._0_2_;
      auVar55._6_2_ = sVar58 - (short)Var21;
      auVar55._8_2_ = sVar59 - auVar16._8_2_;
      auVar55._10_2_ = sVar60 - auVar12._10_2_;
      auVar55._12_2_ = sVar61 - auVar8._12_2_;
      auVar55._14_2_ = sVar62 - (auVar6._13_2_ >> 8);
      auVar7._8_6_ = 0;
      auVar7._0_8_ = uVar3;
      auVar7[0xe] = (char)(uVar3 >> 0x38);
      auVar9._8_4_ = 0;
      auVar9._0_8_ = uVar3;
      auVar9[0xc] = (char)(uVar3 >> 0x30);
      auVar9._13_2_ = auVar7._13_2_;
      auVar11._8_4_ = 0;
      auVar11._0_8_ = uVar3;
      auVar11._12_3_ = auVar9._12_3_;
      auVar13._8_2_ = 0;
      auVar13._0_8_ = uVar3;
      auVar13[10] = (char)(uVar3 >> 0x28);
      auVar13._11_4_ = auVar11._11_4_;
      auVar15._8_2_ = 0;
      auVar15._0_8_ = uVar3;
      auVar15._10_5_ = auVar13._10_5_;
      auVar17[8] = (char)(uVar3 >> 0x20);
      auVar17._0_8_ = uVar3;
      auVar17._9_6_ = auVar15._9_6_;
      auVar23._7_8_ = 0;
      auVar23._0_7_ = auVar17._8_7_;
      Var21 = CONCAT81(SUB158(auVar23 << 0x40,7),(char)(uVar3 >> 0x18));
      auVar27._9_6_ = 0;
      auVar27._0_9_ = Var21;
      auVar24._1_10_ = SUB1510(auVar27 << 0x30,5);
      auVar24[0] = (char)(uVar3 >> 0x10);
      auVar28._11_4_ = 0;
      auVar28._0_11_ = auVar24;
      auVar19[2] = (char)(uVar3 >> 8);
      auVar19._0_2_ = (ushort)uVar3;
      auVar19._3_12_ = SUB1512(auVar28 << 0x20,3);
      auVar32._0_2_ = sVar30 - ((ushort)uVar3 & 0xff);
      auVar32._2_2_ = sVar34 - auVar19._2_2_;
      auVar32._4_2_ = sVar35 - auVar24._0_2_;
      auVar32._6_2_ = sVar36 - (short)Var21;
      auVar32._8_2_ = sVar37 - auVar17._8_2_;
      auVar32._10_2_ = sVar38 - auVar13._10_2_;
      auVar32._12_2_ = sVar39 - auVar9._12_2_;
      auVar32._14_2_ = sVar40 - (auVar7._13_2_ >> 8);
      auVar63._0_2_ = auVar32._0_2_ + auVar55._0_2_;
      auVar63._2_2_ = auVar32._2_2_ + auVar55._2_2_;
      auVar63._4_2_ = auVar32._4_2_ + auVar55._4_2_;
      auVar63._6_2_ = auVar32._6_2_ + auVar55._6_2_;
      auVar63._8_2_ = auVar32._8_2_ + auVar55._8_2_;
      auVar63._10_2_ = auVar32._10_2_ + auVar55._10_2_;
      auVar63._12_2_ = auVar32._12_2_ + auVar55._12_2_;
      auVar63._14_2_ = auVar32._14_2_ + auVar55._14_2_;
      auVar54 = pmaddwd(auVar63,_DAT_00515cc0);
      auVar31._0_4_ = auVar33._0_4_ + auVar54._0_4_;
      auVar31._4_4_ = auVar33._4_4_ + auVar54._4_4_;
      auVar31._8_4_ = auVar33._8_4_ + auVar54._8_4_;
      auVar31._12_4_ = auVar33._12_4_ + auVar54._12_4_;
      auVar54 = pmaddwd(auVar55,auVar55);
      iVar42 = auVar41._4_4_;
      iVar43 = auVar41._8_4_;
      iVar44 = auVar41._12_4_;
      auVar33 = pmaddwd(auVar32,auVar32);
      auVar41._0_4_ = auVar33._0_4_ + auVar54._0_4_ + auVar41._0_4_;
      auVar41._4_4_ = auVar33._4_4_ + auVar54._4_4_ + iVar42;
      auVar41._8_4_ = auVar33._8_4_ + auVar54._8_4_ + iVar43;
      auVar41._12_4_ = auVar33._12_4_ + auVar54._12_4_ + iVar44;
      src_ptr = (uint8_t *)((long)src_ptr + (long)(src_stride * 2));
      m_ptr = (uint8_t *)((long)m_ptr + (long)(m_stride * 2));
      lVar29 = lVar29 + 2;
      auVar33 = auVar31;
    } while ((int)lVar29 < height);
  }
  auVar31 = phaddd(auVar31,auVar41);
  auVar31 = phaddd(auVar31,auVar31);
  *sum_ = auVar31._0_4_;
  auVar31 = phaddd(auVar41,auVar41);
  auVar31 = phaddd(auVar31,auVar31);
  *sse = auVar31._0_4_;
  return;
}

Assistant:

static void masked_variance8xh(const uint8_t *src_ptr, int src_stride,
                               const uint8_t *a_ptr, const uint8_t *b_ptr,
                               const uint8_t *m_ptr, int m_stride, int height,
                               unsigned int *sse, int *sum_) {
  int y;
  __m128i sum = _mm_setzero_si128(), sum_sq = _mm_setzero_si128();

  for (y = 0; y < height; y += 2) {
    __m128i src = _mm_unpacklo_epi64(
        _mm_loadl_epi64((const __m128i *)src_ptr),
        _mm_loadl_epi64((const __m128i *)&src_ptr[src_stride]));
    const __m128i a = _mm_loadu_si128((const __m128i *)a_ptr);
    const __m128i b = _mm_loadu_si128((const __m128i *)b_ptr);
    const __m128i m =
        _mm_unpacklo_epi64(_mm_loadl_epi64((const __m128i *)m_ptr),
                           _mm_loadl_epi64((const __m128i *)&m_ptr[m_stride]));
    accumulate_block(&src, &a, &b, &m, &sum, &sum_sq);

    src_ptr += src_stride * 2;
    a_ptr += 16;
    b_ptr += 16;
    m_ptr += m_stride * 2;
  }
  // Reduce down to a single sum and sum of squares
  sum = _mm_hadd_epi32(sum, sum_sq);
  sum = _mm_hadd_epi32(sum, sum);
  *sum_ = _mm_cvtsi128_si32(sum);
  *sse = (unsigned int)_mm_cvtsi128_si32(_mm_srli_si128(sum, 4));
}